

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipe.cpp
# Opt level: O2

void just_test_test_case_f_test_pipe_write_and_read(void)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int __fd;
  char *__pipedes;
  pipe p;
  allocator<char> local_85;
  pipe local_84;
  assert_equal local_78;
  allocator<char> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_10 [2];
  
  pipe(local_10);
  local_84.input._fd = local_10[0];
  local_84.input._eof = false;
  local_84.output._fd = local_10[1];
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Hello",local_50);
  __fd = (int)&local_78;
  just::process::impl::output_file::write(&local_84.output,__fd,__buf,in_RCX);
  std::__cxx11::string::~string((string *)&local_78);
  just::process::impl::output_file::close(&local_84.output,__fd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/process/test/test_pipe.cpp"
             ,&local_85);
  std::__cxx11::string::string((string *)&local_78,(string *)local_50);
  local_78._assert_msg._line = 0x18;
  just::process::impl::input_file::read_abi_cxx11_
            ((input_file *)&local_30,(int)&local_84,__buf_00,in_RCX);
  __pipedes = "Hello";
  just::test::assert_equal::operator()(&local_78,"Hello",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_50);
  just::process::impl::pipe::~pipe(&local_84,(int *)__pipedes);
  return;
}

Assistant:

JUST_TEST_CASE(test_pipe_write_and_read)
{
  just::process::impl::pipe p;
  p.output.write("Hello");
  p.output.close();

  JUST_ASSERT_EQUAL("Hello", p.input.read());
}